

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (status == 0) {
    pvVar2 = malloc(0xf8);
    if (pvVar2 == (void *)0x0) {
      pcVar3 = "handle != NULL";
      uStack_20 = 0x2f;
    }
    else {
      iVar1 = uv_tcp_init_ex(server->loop,pvVar2,2);
      if (iVar1 == 0) {
        iVar1 = uv_accept(server,pvVar2);
        if (iVar1 == -0x10) {
          uv_close(server,0);
          uv_close(pvVar2,free);
          return;
        }
        pcVar3 = "r == UV_EBUSY";
        uStack_20 = 0x35;
      }
      else {
        pcVar3 = "r == 0";
        uStack_20 = 0x32;
      }
    }
  }
  else {
    pcVar3 = "status == 0";
    uStack_20 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* conn;
  int r;

  if (!local_conn_accepted) {
    /* Accept the connection and close it.  Also and close the server. */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    conn = malloc(sizeof(*conn));
    ASSERT(conn);
    r = uv_tcp_init(server->loop, conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)conn, close_server_conn_cb);
    uv_close((uv_handle_t*)server, NULL);
    local_conn_accepted = 1;
  }
}